

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_strategy.h
# Opt level: O0

int64_t __thiscall
disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>::WaitFor
          (SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1> *this,
          int64_t *sequence,Sequence *cursor,
          vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *dependents,
          atomic<bool> *alerted)

{
  bool bVar1;
  long *in_RSI;
  atomic<bool> *in_RDI;
  function<long_()> min_sequence;
  int counter;
  int64_t available_sequence;
  function<long_()> *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  Sequence *in_stack_ffffffffffffff98;
  undefined8 local_8;
  
  buildMinSequenceFunction
            (in_stack_ffffffffffffff98,
             (vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  do {
    in_stack_ffffffffffffff80 =
         (function<long_()> *)std::function<long_()>::operator()(in_stack_ffffffffffffff80);
    local_8 = in_stack_ffffffffffffff80;
    if (*in_RSI <= (long)in_stack_ffffffffffffff80) {
LAB_0012f2f0:
      std::function<long_()>::~function((function<long_()> *)0x12f2fa);
      return (int64_t)local_8;
    }
    bVar1 = std::atomic<bool>::load(in_RDI,(memory_order)((ulong)in_stack_ffffffffffffff80 >> 0x20))
    ;
    if (bVar1) {
      local_8 = (function<long_()> *)0xfffffffffffffffe;
      goto LAB_0012f2f0;
    }
    ApplyWaitMethod((SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>
                     *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),(int64_t)in_RDI
                   );
  } while( true );
}

Assistant:

int64_t WaitFor(const int64_t& sequence, const Sequence& cursor,
                  const std::vector<Sequence*>& dependents,
                  const std::atomic<bool>& alerted) {
    int64_t available_sequence = kInitialCursorValue;
    int counter = S;

    const auto min_sequence = buildMinSequenceFunction(cursor, dependents);

    while ((available_sequence = min_sequence()) < sequence) {
      if (alerted.load()) return kAlertedSignal;

      counter = ApplyWaitMethod(counter);
    }

    return available_sequence;
  }